

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mipsdsp_add_cmp_pick
               (DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2,
               int check_ret)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  TCGTemp *a1;
  int nargs;
  uintptr_t o_3;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  code *pcVar4;
  uintptr_t o_2;
  uintptr_t o_6;
  TCGv_i64 ret_00;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_ptr local_48;
  uint32_t local_3c;
  TCGTemp *local_38;
  
  if (check_ret == 1 && ret == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  local_3c = op1;
  local_38 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar2 = (TCGv_i64)((long)pTVar1 - (long)s);
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (v1 == 0) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar1,0);
  }
  else if (s->cpu_gpr[v1] != pTVar2) {
    tcg_gen_op2_mips64el
              (s,INDEX_op_mov_i64,(TCGArg)pTVar1,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[v1])
              );
  }
  pTVar1 = local_38;
  pTVar3 = (TCGv_i64)((long)a1 - (long)s);
  if (v2 == 0) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1,0);
    pTVar1 = local_38;
  }
  else if (s->cpu_gpr[v2] != pTVar3) {
    tcg_gen_op2_mips64el
              (s,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[v2]));
  }
  ret_00 = (TCGv_i64)((long)pTVar1 - (long)s);
  if (local_3c != 0x7c000015) {
    if (local_3c != 0x7c000011) goto switchD_009bcf90_caseD_7;
    switch((op2 + 0x83ffffef) * 0x4000000 | op2 + 0x83ffffef >> 6) {
    case 0:
      check_dsp(ctx);
      local_48 = s->cpu_env + (long)s;
      pcVar4 = helper_cmpu_eq_qb_mips64el;
      break;
    case 1:
      check_dsp(ctx);
      local_48 = s->cpu_env + (long)s;
      pcVar4 = helper_cmpu_lt_qb_mips64el;
      break;
    case 2:
      check_dsp(ctx);
      local_48 = s->cpu_env + (long)s;
      pcVar4 = helper_cmpu_le_qb_mips64el;
      break;
    case 3:
      check_dsp(ctx);
      local_48 = s->cpu_env + (long)s;
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_pick_qb_mips64el;
      goto LAB_009bd81f;
    case 4:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_cmpgu_eq_qb_mips64el;
      goto LAB_009bd659;
    case 5:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_cmpgu_lt_qb_mips64el;
      goto LAB_009bd659;
    case 6:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_cmpgu_le_qb_mips64el;
      goto LAB_009bd659;
    default:
      goto switchD_009bcf90_caseD_7;
    case 8:
      check_dsp(ctx);
      local_48 = s->cpu_env + (long)s;
      pcVar4 = helper_cmp_eq_ph_mips64el;
      break;
    case 9:
      check_dsp(ctx);
      local_48 = s->cpu_env + (long)s;
      pcVar4 = helper_cmp_lt_ph_mips64el;
      break;
    case 10:
      check_dsp(ctx);
      local_48 = s->cpu_env + (long)s;
      pcVar4 = helper_cmp_le_ph_mips64el;
      break;
    case 0xb:
      check_dsp(ctx);
      local_48 = s->cpu_env + (long)s;
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_pick_ph_mips64el;
      goto LAB_009bd81f;
    case 0xe:
      check_dsp(ctx);
      pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      pcVar4 = helper_packrl_ph_mips64el;
      goto LAB_009bd659;
    case 0x18:
      check_dsp_r2(ctx);
      pcVar4 = helper_cmpgu_eq_qb_mips64el;
      goto LAB_009bd24c;
    case 0x19:
      check_dsp_r2(ctx);
      pcVar4 = helper_cmpgu_lt_qb_mips64el;
      goto LAB_009bd24c;
    case 0x1a:
      check_dsp_r2(ctx);
      pcVar4 = helper_cmpgu_le_qb_mips64el;
LAB_009bd24c:
      local_50 = (TCGv_i64)((long)s + (long)pTVar3);
      local_58 = (TCGTemp *)((long)s + (long)pTVar2);
      tcg_gen_callN_mips64el(s,pcVar4,(TCGTemp *)((long)s + (long)ret_00),2,&local_58);
      if (s->cpu_gpr[(uint)ret] != ret_00) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[(uint)ret] + (long)s),(TCGArg)pTVar1);
      }
      tcg_gen_andi_i64_mips64el(s,s->cpu_dspctrl,s->cpu_dspctrl,0xf0ffffff);
      tcg_gen_shli_i64_mips64el(s,ret_00,ret_00,0x18);
      tcg_gen_op3_mips64el
                (s,INDEX_op_or_i64,(TCGArg)(s->cpu_dspctrl + (long)s),
                 (TCGArg)(s->cpu_dspctrl + (long)s),(TCGArg)pTVar1);
      goto switchD_009bcf90_caseD_7;
    }
    goto LAB_009bd78a;
  }
  switch((op2 + 0x83ffffeb) * 0x4000000 | op2 + 0x83ffffeb >> 6) {
  case 0:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pcVar4 = helper_cmpu_eq_ob_mips64el;
    break;
  case 1:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pcVar4 = helper_cmpu_lt_ob_mips64el;
    break;
  case 2:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pcVar4 = helper_cmpu_le_ob_mips64el;
    break;
  case 3:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_pick_ob_mips64el;
    goto LAB_009bd81f;
  case 4:
    check_dsp(ctx);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_cmpgu_eq_ob_mips64el;
    goto LAB_009bd659;
  case 5:
    check_dsp(ctx);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_cmpgu_lt_ob_mips64el;
    goto LAB_009bd659;
  case 6:
    check_dsp(ctx);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_cmpgu_le_ob_mips64el;
    goto LAB_009bd659;
  default:
    goto switchD_009bcf90_caseD_7;
  case 8:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pcVar4 = helper_cmp_eq_qh_mips64el;
    break;
  case 9:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pcVar4 = helper_cmp_lt_qh_mips64el;
    break;
  case 10:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pcVar4 = helper_cmp_le_qh_mips64el;
    break;
  case 0xb:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_pick_qh_mips64el;
    goto LAB_009bd81f;
  case 0xe:
    check_dsp(ctx);
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_packrl_pw_mips64el;
LAB_009bd659:
    nargs = 2;
    goto LAB_009bd824;
  case 0x10:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pcVar4 = helper_cmp_eq_pw_mips64el;
    break;
  case 0x11:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pcVar4 = helper_cmp_lt_pw_mips64el;
    break;
  case 0x12:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pcVar4 = helper_cmp_le_pw_mips64el;
    break;
  case 0x13:
    check_dsp(ctx);
    local_48 = s->cpu_env + (long)s;
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_pick_pw_mips64el;
    goto LAB_009bd81f;
  case 0x18:
    check_dsp_r2(ctx);
    local_48 = s->cpu_env + (long)s;
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_cmpgdu_eq_ob_mips64el;
    goto LAB_009bd81f;
  case 0x19:
    check_dsp_r2(ctx);
    local_48 = s->cpu_env + (long)s;
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_cmpgdu_lt_ob_mips64el;
    goto LAB_009bd81f;
  case 0x1a:
    check_dsp_r2(ctx);
    local_48 = s->cpu_env + (long)s;
    pTVar1 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    pcVar4 = helper_cmpgdu_le_ob_mips64el;
    goto LAB_009bd81f;
  }
LAB_009bd78a:
  pTVar1 = (TCGTemp *)0x0;
LAB_009bd81f:
  nargs = 3;
LAB_009bd824:
  local_50 = (TCGv_i64)((long)s + (long)pTVar3);
  local_58 = (TCGTemp *)((long)s + (long)pTVar2);
  tcg_gen_callN_mips64el(s,pcVar4,pTVar1,nargs,&local_58);
switchD_009bcf90_caseD_7:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret_00 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar2 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar3 + (long)s));
  return;
}

Assistant:

static void gen_mipsdsp_add_cmp_pick(DisasContext *ctx,
                                     uint32_t op1, uint32_t op2,
                                     int ret, int v1, int v2, int check_ret)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t1;
    TCGv v1_t;
    TCGv v2_t;

    if ((ret == 0) && (check_ret == 1)) {
        /* Treat as NOP. */
        return;
    }

    t1 = tcg_temp_new(tcg_ctx);
    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    case OPC_CMPU_EQ_QB_DSP:
        switch (op2) {
        case OPC_CMPU_EQ_QB:
            check_dsp(ctx);
            gen_helper_cmpu_eq_qb(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LT_QB:
            check_dsp(ctx);
            gen_helper_cmpu_lt_qb(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LE_QB:
            check_dsp(ctx);
            gen_helper_cmpu_le_qb(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGU_EQ_QB:
            check_dsp(ctx);
            gen_helper_cmpgu_eq_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LT_QB:
            check_dsp(ctx);
            gen_helper_cmpgu_lt_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LE_QB:
            check_dsp(ctx);
            gen_helper_cmpgu_le_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGDU_EQ_QB:
            check_dsp_r2(ctx);
            gen_helper_cmpgu_eq_qb(tcg_ctx, t1, v1_t, v2_t);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], t1);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, 0xF0FFFFFF);
            tcg_gen_shli_tl(tcg_ctx, t1, t1, 24);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, t1);
            break;
        case OPC_CMPGDU_LT_QB:
            check_dsp_r2(ctx);
            gen_helper_cmpgu_lt_qb(tcg_ctx, t1, v1_t, v2_t);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], t1);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, 0xF0FFFFFF);
            tcg_gen_shli_tl(tcg_ctx, t1, t1, 24);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, t1);
            break;
        case OPC_CMPGDU_LE_QB:
            check_dsp_r2(ctx);
            gen_helper_cmpgu_le_qb(tcg_ctx, t1, v1_t, v2_t);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], t1);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, 0xF0FFFFFF);
            tcg_gen_shli_tl(tcg_ctx, t1, t1, 24);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, t1);
            break;
        case OPC_CMP_EQ_PH:
            check_dsp(ctx);
            gen_helper_cmp_eq_ph(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LT_PH:
            check_dsp(ctx);
            gen_helper_cmp_lt_ph(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LE_PH:
            check_dsp(ctx);
            gen_helper_cmp_le_ph(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_QB:
            check_dsp(ctx);
            gen_helper_pick_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_PH:
            check_dsp(ctx);
            gen_helper_pick_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PACKRL_PH:
            check_dsp(ctx);
            gen_helper_packrl_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_CMPU_EQ_OB_DSP:
        switch (op2) {
        case OPC_CMP_EQ_PW:
            check_dsp(ctx);
            gen_helper_cmp_eq_pw(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LT_PW:
            check_dsp(ctx);
            gen_helper_cmp_lt_pw(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LE_PW:
            check_dsp(ctx);
            gen_helper_cmp_le_pw(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_EQ_QH:
            check_dsp(ctx);
            gen_helper_cmp_eq_qh(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LT_QH:
            check_dsp(ctx);
            gen_helper_cmp_lt_qh(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LE_QH:
            check_dsp(ctx);
            gen_helper_cmp_le_qh(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGDU_EQ_OB:
            check_dsp_r2(ctx);
            gen_helper_cmpgdu_eq_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGDU_LT_OB:
            check_dsp_r2(ctx);
            gen_helper_cmpgdu_lt_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGDU_LE_OB:
            check_dsp_r2(ctx);
            gen_helper_cmpgdu_le_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGU_EQ_OB:
            check_dsp(ctx);
            gen_helper_cmpgu_eq_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LT_OB:
            check_dsp(ctx);
            gen_helper_cmpgu_lt_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LE_OB:
            check_dsp(ctx);
            gen_helper_cmpgu_le_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPU_EQ_OB:
            check_dsp(ctx);
            gen_helper_cmpu_eq_ob(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LT_OB:
            check_dsp(ctx);
            gen_helper_cmpu_lt_ob(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LE_OB:
            check_dsp(ctx);
            gen_helper_cmpu_le_ob(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PACKRL_PW:
            check_dsp(ctx);
            gen_helper_packrl_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PICK_OB:
            check_dsp(ctx);
            gen_helper_pick_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_PW:
            check_dsp(ctx);
            gen_helper_pick_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_QH:
            check_dsp(ctx);
            gen_helper_pick_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}